

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int Page_Navigation(_func_int_FORM_ptr *fct,FORM_conflict *form)

{
  _Bool _Var1;
  int local_1c;
  int res;
  FORM_conflict *form_local;
  _func_int_FORM_ptr *fct_local;
  
  _Var1 = _nc_Internal_Validation(form);
  if (_Var1) {
    if ((form != (FORM_conflict *)0x0) &&
       (form->fieldterm != (_func_void_formnode_ptr_conflict *)0x0)) {
      form->status = form->status | 2;
      (*form->fieldterm)(form);
      form->status = form->status & 0xfffd;
    }
    if ((form != (FORM_conflict *)0x0) &&
       (form->formterm != (_func_void_formnode_ptr_conflict *)0x0)) {
      form->status = form->status | 2;
      (*form->formterm)(form);
      form->status = form->status & 0xfffd;
    }
    local_1c = (*fct)(form);
    if ((form != (FORM_conflict *)0x0) &&
       (form->forminit != (_func_void_formnode_ptr_conflict *)0x0)) {
      form->status = form->status | 2;
      (*form->forminit)(form);
      form->status = form->status & 0xfffd;
    }
    if ((form != (FORM_conflict *)0x0) &&
       (form->fieldinit != (_func_void_formnode_ptr_conflict *)0x0)) {
      form->status = form->status | 2;
      (*form->fieldinit)(form);
      form->status = form->status & 0xfffd;
    }
  }
  else {
    local_1c = -0xd;
  }
  return local_1c;
}

Assistant:

static int Page_Navigation(int (* const fct) (FORM *), FORM * form)
{
  int res;

  if (!_nc_Internal_Validation(form)) 
    res = E_INVALID_FIELD;
  else
    {
      Call_Hook(form,fieldterm);
      Call_Hook(form,formterm);
      res = fct(form);
      Call_Hook(form,forminit);
      Call_Hook(form,fieldinit);
    }
  return res;
}